

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

TokenStream * __thiscall Catch::Clara::Detail::TokenStream::operator++(TokenStream *this)

{
  const_iterator __position;
  StringRef *pSVar1;
  
  __position._M_current =
       (this->m_tokenBuffer).
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current) /
             0x18) < 2) {
    pSVar1 = (this->it)._M_current;
    if (pSVar1 != (this->itEnd)._M_current) {
      (this->it)._M_current = pSVar1 + 1;
    }
    loadBuffer(this);
  }
  else {
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::erase
              (&this->m_tokenBuffer,__position);
  }
  return this;
}

Assistant:

TokenStream& TokenStream::operator++() {
                if ( m_tokenBuffer.size() >= 2 ) {
                    m_tokenBuffer.erase( m_tokenBuffer.begin() );
                } else {
                    if ( it != itEnd )
                        ++it;
                    loadBuffer();
                }
                return *this;
            }